

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::SyncTransaction
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool update_tx,
          bool rescanning_old_block)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = AddToWalletIfInvolvingMe(this,ptx,state,update_tx,rescanning_old_block);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      MarkInputsDirty(this,ptx);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SyncTransaction(const CTransactionRef& ptx, const SyncTxState& state, bool update_tx, bool rescanning_old_block)
{
    if (!AddToWalletIfInvolvingMe(ptx, state, update_tx, rescanning_old_block))
        return; // Not one of ours

    // If a transaction changes 'conflicted' state, that changes the balance
    // available of the outputs it spends. So force those to be
    // recomputed, also:
    MarkInputsDirty(ptx);
}